

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLRParser.cpp
# Opt level: O2

set<std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>,_std::less<std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>,_std::allocator<std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>_>
* __thiscall
GLRParser::parseString
          (set<std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>,_std::less<std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>,_std::allocator<std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>_>
           *__return_storage_ptr__,GLRParser *this,string *toParse)

{
  _Rb_tree_header *p_Var1;
  char c;
  int *piVar2;
  size_type sVar3;
  pointer ppVar4;
  bool bVar5;
  bool bVar6;
  char *pcVar7;
  GLRState *pGVar8;
  _Base_ptr p_Var9;
  ostream *poVar10;
  GLRParser *pGVar11;
  char *pcVar12;
  pointer ppVar13;
  _Elt_pointer pbVar14;
  long lVar15;
  ulong uVar16;
  vector<std::pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>,_std::allocator<std::pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>_>_>
  possibleParseStacks;
  size_type local_1f8;
  vector<std::pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>,_std::allocator<std::pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>_>_>
  newPossibleParseStacks;
  set<std::pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_Production_*>,_std::less<std::pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_Production_*>_>,_std::allocator<std::pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_Production_*>_>_>
  alreadyReducedStacks;
  string succes;
  set<ParseOperation_*,_std::less<ParseOperation_*>,_std::allocator<ParseOperation_*>_>
  parseOperations;
  pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>
  newStack;
  stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  startStack;
  
  possibleParseStacks.
  super__Vector_base<std::pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>,_std::allocator<std::pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  possibleParseStacks.
  super__Vector_base<std::pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>,_std::allocator<std::pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  possibleParseStacks.
  super__Vector_base<std::pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>,_std::allocator<std::pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  stack<std::__cxx11::string,std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
  ::stack<std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>,void>(&startStack);
  std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&startStack.c,&this->startState->name);
  std::stack<Production*,std::deque<Production*,std::allocator<Production*>>>::
  stack<std::deque<Production*,std::allocator<Production*>>,void>
            ((stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_> *)
             &parseOperations);
  std::
  pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>
  ::
  pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&,_true>
            (&newStack,&startStack,
             (stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_> *)
             &parseOperations);
  std::
  vector<std::pair<std::stack<std::__cxx11::string,std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::stack<Production*,std::deque<Production*,std::allocator<Production*>>>>,std::allocator<std::pair<std::stack<std::__cxx11::string,std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::stack<Production*,std::deque<Production*,std::allocator<Production*>>>>>>
  ::
  emplace_back<std::pair<std::stack<std::__cxx11::string,std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::stack<Production*,std::deque<Production*,std::allocator<Production*>>>>>
            ((vector<std::pair<std::stack<std::__cxx11::string,std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::stack<Production*,std::deque<Production*,std::allocator<Production*>>>>,std::allocator<std::pair<std::stack<std::__cxx11::string,std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::stack<Production*,std::deque<Production*,std::allocator<Production*>>>>>>
              *)&possibleParseStacks,&newStack);
  std::
  pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>
  ::~pair(&newStack);
  std::_Deque_base<Production_*,_std::allocator<Production_*>_>::~_Deque_base
            ((_Deque_base<Production_*,_std::allocator<Production_*>_> *)&parseOperations);
  succes._M_dataplus._M_p = (pointer)&succes.field_2;
  succes._M_string_length = 0;
  succes.field_2._M_local_buf[0] = '\0';
  pcVar12 = (toParse->_M_dataplus)._M_p;
  pcVar7 = pcVar12 + toParse->_M_string_length;
  local_1f8 = 0;
  bVar6 = false;
  do {
    ppVar4 = possibleParseStacks.
             super__Vector_base<std::pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>,_std::allocator<std::pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pcVar12 == pcVar7) {
      p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
      (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)0x0;
      (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
           &p_Var1->_M_header;
      (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
           &p_Var1->_M_header;
      (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
      for (ppVar13 = possibleParseStacks.
                     super__Vector_base<std::pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>,_std::allocator<std::pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; ppVar13 != ppVar4;
          ppVar13 = ppVar13 + 1) {
        std::
        pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>
        ::pair(&newStack,ppVar13);
        pbVar14 = newStack.first.c.
                  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (newStack.first.c.
            super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            newStack.first.c.
            super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_first) {
          pbVar14 = newStack.first.c.
                    super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x10;
        }
        bVar6 = std::operator==(pbVar14 + -1,"accept");
        if (bVar6) {
          std::
          _Rb_tree<std::stack<Production*,std::deque<Production*,std::allocator<Production*>>>,std::stack<Production*,std::deque<Production*,std::allocator<Production*>>>,std::_Identity<std::stack<Production*,std::deque<Production*,std::allocator<Production*>>>>,std::less<std::stack<Production*,std::deque<Production*,std::allocator<Production*>>>>,std::allocator<std::stack<Production*,std::deque<Production*,std::allocator<Production*>>>>>
          ::
          _M_insert_unique<std::stack<Production*,std::deque<Production*,std::allocator<Production*>>>const&>
                    ((_Rb_tree<std::stack<Production*,std::deque<Production*,std::allocator<Production*>>>,std::stack<Production*,std::deque<Production*,std::allocator<Production*>>>,std::_Identity<std::stack<Production*,std::deque<Production*,std::allocator<Production*>>>>,std::less<std::stack<Production*,std::deque<Production*,std::allocator<Production*>>>>,std::allocator<std::stack<Production*,std::deque<Production*,std::allocator<Production*>>>>>
                      *)__return_storage_ptr__,&newStack.second);
          poVar10 = std::operator<<((ostream *)&std::cout,"String accepted.");
          std::endl<char,std::char_traits<char>>(poVar10);
        }
        std::
        pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>
        ::~pair(&newStack);
      }
      if ((__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count == 0) {
        poVar10 = std::operator<<((ostream *)&std::cout,
                                  "Something went wrong, probably after this text: ");
        std::endl<char,std::char_traits<char>>(poVar10);
        poVar10 = std::operator<<((ostream *)&std::cout,(string *)&succes);
        std::endl<char,std::char_traits<char>>(poVar10);
      }
      std::__cxx11::string::~string((string *)&succes);
      std::
      deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~deque(&startStack.c);
      std::
      vector<std::pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>,_std::allocator<std::pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>_>_>
      ::~vector(&possibleParseStacks);
      return __return_storage_ptr__;
    }
    c = *pcVar12;
    newPossibleParseStacks.
    super__Vector_base<std::pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>,_std::allocator<std::pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_1f8 = local_1f8 + 1;
    newPossibleParseStacks.
    super__Vector_base<std::pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>,_std::allocator<std::pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    newPossibleParseStacks.
    super__Vector_base<std::pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>,_std::allocator<std::pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    for (ppVar13 = possibleParseStacks.
                   super__Vector_base<std::pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>,_std::allocator<std::pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; ppVar13 != ppVar4;
        ppVar13 = ppVar13 + 1) {
      pbVar14 = (ppVar13->first).c.
                super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (pbVar14 ==
          (ppVar13->first).c.
          super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_first) {
        pbVar14 = (ppVar13->first).c.
                  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x10;
      }
      bVar5 = std::operator==(pbVar14 + -1,"accept");
      if ((bVar5) && (toParse->_M_string_length == local_1f8)) break;
      pbVar14 = (ppVar13->first).c.
                super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (pbVar14 ==
          (ppVar13->first).c.
          super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_first) {
        pbVar14 = (ppVar13->first).c.
                  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x10;
      }
      pGVar8 = findState(this,pbVar14 + -1);
      toString_abi_cxx11_((string *)&newStack,c);
      findParseOptions(&parseOperations,this,(string *)&newStack,pGVar8);
      std::__cxx11::string::~string((string *)&newStack);
      for (p_Var9 = parseOperations._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var9 != &parseOperations._M_t._M_impl.super__Rb_tree_header;
          p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9)) {
        piVar2 = *(int **)(p_Var9 + 1);
        std::
        pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>
        ::pair(&newStack,ppVar13);
        if (*piVar2 == 1) {
          toString_abi_cxx11_((string *)&alreadyReducedStacks,c);
          std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((deque<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&newStack,
                     (string *)&alreadyReducedStacks);
          std::__cxx11::string::~string((string *)&alreadyReducedStacks);
          std::
          deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&newStack,*(value_type **)(piVar2 + 4));
          std::
          vector<std::pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>,_std::allocator<std::pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>_>_>
          ::push_back(&newPossibleParseStacks,(value_type *)&newStack);
        }
        std::
        pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>
        ::~pair(&newStack);
      }
      std::
      _Rb_tree<ParseOperation_*,_ParseOperation_*,_std::_Identity<ParseOperation_*>,_std::less<ParseOperation_*>,_std::allocator<ParseOperation_*>_>
      ::~_Rb_tree(&parseOperations._M_t);
    }
    pGVar11 = (GLRParser *)&possibleParseStacks;
    std::
    vector<std::pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>,_std::allocator<std::pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>_>_>
    ::operator=((vector<std::pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>,_std::allocator<std::pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>_>_>
                 *)pGVar11,&newPossibleParseStacks);
    if (possibleParseStacks.
        super__Vector_base<std::pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>,_std::allocator<std::pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        possibleParseStacks.
        super__Vector_base<std::pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>,_std::allocator<std::pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pGVar11 = (GLRParser *)&succes;
      std::__cxx11::string::push_back((char)pGVar11);
    }
    removeDuplicates(pGVar11,&possibleParseStacks);
    if (this->verbose == true) {
      poVar10 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      poVar10 = std::operator<<(poVar10,"Output after processing ");
      toString_abi_cxx11_((string *)&newStack,c);
      poVar10 = std::operator<<(poVar10,(string *)&newStack);
      std::endl<char,std::char_traits<char>>(poVar10);
      pGVar11 = (GLRParser *)&newStack;
      std::__cxx11::string::~string((string *)&newStack);
      printStackSet(pGVar11,&possibleParseStacks);
    }
    alreadyReducedStacks._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    alreadyReducedStacks._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    alreadyReducedStacks._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &alreadyReducedStacks._M_t._M_impl.super__Rb_tree_header._M_header;
    alreadyReducedStacks._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    lVar15 = 0;
    uVar16 = 0xffffffffffffffff;
    alreadyReducedStacks._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         alreadyReducedStacks._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      uVar16 = uVar16 + 1;
      if ((ulong)(((long)possibleParseStacks.
                         super__Vector_base<std::pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>,_std::allocator<std::pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                  (long)possibleParseStacks.
                        super__Vector_base<std::pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>,_std::allocator<std::pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start) / 0xa0) <= uVar16)
      goto LAB_0011bd1a;
      std::
      pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>
      ::pair(&newStack,
             (pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>
              *)((long)&((possibleParseStacks.
                          super__Vector_base<std::pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>,_std::allocator<std::pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->first).c.
                        super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Deque_impl_data._M_map + lVar15));
      pbVar14 = newStack.first.c.
                super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (newStack.first.c.
          super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          newStack.first.c.
          super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_first) {
        pbVar14 = newStack.first.c.
                  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x10;
      }
      pGVar8 = findState(this,pbVar14 + -1);
      std::deque<Production_*,_std::allocator<Production_*>_>::deque
                ((deque<Production_*,_std::allocator<Production_*>_> *)&parseOperations,
                 &newStack.second.c);
      bVar5 = checkProductionRules
                        (this,&possibleParseStacks,
                         (stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&newStack,
                         (stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>
                          *)&parseOperations,pGVar8,&alreadyReducedStacks,bVar6);
      lVar15 = lVar15 + 0xa0;
      sVar3 = toParse->_M_string_length;
      std::_Deque_base<Production_*,_std::allocator<Production_*>_>::~_Deque_base
                ((_Deque_base<Production_*,_std::allocator<Production_*>_> *)&parseOperations);
      pGVar11 = (GLRParser *)&newStack;
      std::
      pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>
      ::~pair(&newStack);
    } while (sVar3 != local_1f8 || !bVar5);
    bVar6 = true;
LAB_0011bd1a:
    removeDuplicates(pGVar11,&possibleParseStacks);
    if (this->verbose == true) {
      pGVar11 = (GLRParser *)
                std::operator<<((ostream *)&std::cout,
                                "Output after reducing and eleminating doubles: ");
      std::endl<char,std::char_traits<char>>((ostream *)pGVar11);
      printStackSet(pGVar11,&possibleParseStacks);
    }
    std::
    _Rb_tree<std::pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_Production_*>,_std::pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_Production_*>,_std::_Identity<std::pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_Production_*>_>,_std::less<std::pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_Production_*>_>,_std::allocator<std::pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_Production_*>_>_>
    ::~_Rb_tree(&alreadyReducedStacks._M_t);
    std::
    vector<std::pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>,_std::allocator<std::pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>_>_>
    ::~vector(&newPossibleParseStacks);
    pcVar12 = pcVar12 + 1;
  } while( true );
}

Assistant:

set<stack<Production *>> GLRParser::parseString(const std::string &toParse) {

    std::vector<std::pair<std::stack<std::string>, std::stack<Production *>>> possibleParseStacks; // Must be a vector to be able to append at the end

    std::stack<std::string> startStack;
    startStack.push(startState->getName());
    possibleParseStacks.push_back(std::pair<std::stack<std::string>, std::stack<Production *>>(startStack, {}));

    bool finalStack = false;

    std::string succes;

    int position = 0;
    for (auto c: toParse) {
        position++;

//        if (c == ' ' or c == '\n') { continue; }

        std::vector<std::pair<std::stack<std::string>, std::stack<Production *>>> newPossibleParseStacks;
        for (auto &stack : possibleParseStacks) {
            // Can't use auto iterator, because we're inserting elements during the loop

            if (stack.first.top() == "accept" and position == toParse.size()) { break; }
            GLRState *currentState = findState(stack.first.top());

            //            std::pair<std::string, GLRState *> searchKey{toString(c), currentState};
//            std::set<ParseOperation *> parseOperations = parseTable[searchKey];

            set<ParseOperation *> parseOperations = findParseOptions(toString(c), currentState);

            for (auto parseOperation: parseOperations) {

                std::pair<std::stack<std::string>, std::stack<Production *>> newStack = stack;

                if (parseOperation->getOperationType() == ParseOperation::shift) {

                    newStack.first.push(toString(c));
                    newStack.first.push(parseOperation->getNewState()->getName());
                    newPossibleParseStacks.push_back(newStack);

                } else {
                    continue; // Don't push the stack back
                }

            }
        }
        possibleParseStacks = newPossibleParseStacks;

        if (!possibleParseStacks.empty()) {
            succes += c;
        }

        removeDuplicates(possibleParseStacks);
        if (verbose) {
            std::cout << std::endl << "Output after processing " << toString(c) << std::endl;
            printStackSet(possibleParseStacks);
        }

        std::set<std::pair<std::stack<std::string>, Production *>> alreadyReducedStacks; // S -> a, S->ab, after input a, you only want one of the stacks to be reduced
        // Check the production rules in the new added stacks
        for (int i = 0; i < possibleParseStacks.size(); ++i) {
            const std::pair<std::stack<std::string>, std::stack<Production *>> stack = possibleParseStacks[i];
            GLRState *currentState = findState(stack.first.top());
            std::stack<Production *> productions = stack.second;
            if (checkProductionRules(possibleParseStacks, stack.first, productions, currentState,
                                     alreadyReducedStacks, finalStack)) {
                if (position == toParse.size()) {
                    finalStack = true;
                    break;
                } else {
                    continue;
                }
            }
        }

        removeDuplicates(possibleParseStacks);

        if (verbose) {
            std::cout << "Output after reducing and eleminating doubles: " << std::endl;
            printStackSet(possibleParseStacks);
        }
    }

//    bool final = false;
    std::set<std::stack<Production *>> finals;
    for (auto stack: possibleParseStacks) {
        // TODO: Check: is it always the case when top == 1, the string is accepted?
        if (stack.first.top() == "accept") {
//                final = true;
            finals.insert(
                    stack.second); // TODO: Check whether it still returns and the object doesn't get destroyed when leaving the function
            std::cout << "String accepted." << std::endl;
        }
    }

    if (finals.empty()) {
        std::cout << "Something went wrong, probably after this text: " << std::endl;
        std::cout << succes << std::endl;
    }

    return finals;
}